

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O3

size_t embree::mapThreadID(size_t threadID)

{
  undefined8 *puVar1;
  bool bVar2;
  uint uVar3;
  int i_1;
  int iVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  pthread_t __th;
  int j;
  unsigned_long *puVar8;
  iterator iVar9;
  unsigned_long *puVar10;
  unsigned_long *puVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  unsigned_long uVar15;
  uint __len;
  string __str;
  string cpu;
  int i;
  Lock<embree::MutexSys> lock;
  cpu_set_t set;
  ulong *local_308;
  long local_300;
  ulong local_2f8;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  ulong local_2e8;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0 [2];
  undefined8 *local_2c0;
  undefined8 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  ulong *local_2a0;
  long local_298;
  ulong local_290 [2];
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  size_t local_260;
  undefined8 *local_258;
  undefined1 local_250;
  cpu_set_t local_248 [4];
  
  local_258 = &mutex;
  local_250 = 1;
  MutexSys::lock((MutexSys *)&mutex);
  puVar8 = DAT_021d2eb8._M_current;
  if (DAT_021d2eb8._M_current == threadIDs) {
    local_2e8 = 0;
    local_260 = threadID;
    do {
      std::fstream::fstream((istream *)local_248);
      local_2a0 = local_290;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2a0,"/sys/devices/system/cpu/cpu","");
      uVar14 = -local_2e8;
      if (0 < (long)local_2e8) {
        uVar14 = local_2e8;
      }
      __len = 1;
      if (9 < uVar14) {
        uVar13 = uVar14;
        uVar3 = 4;
        do {
          __len = uVar3;
          if (uVar13 < 100) {
            __len = __len - 2;
            goto LAB_01f7652c;
          }
          if (uVar13 < 1000) {
            __len = __len - 1;
            goto LAB_01f7652c;
          }
          if (uVar13 < 10000) goto LAB_01f7652c;
          bVar2 = 99999 < uVar13;
          uVar13 = uVar13 / 10000;
          uVar3 = __len + 4;
        } while (bVar2);
        __len = __len + 1;
      }
LAB_01f7652c:
      lVar12 = (long)local_2e8 >> 0x3f;
      local_2e0 = local_2d0;
      std::__cxx11::string::_M_construct
                ((ulong)&local_2e0,(char)__len - (char)((long)local_2e8 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                ((char *)((long)local_2e0 - lVar12),__len,uVar14);
      uVar14 = 0xf;
      if (local_2a0 != local_290) {
        uVar14 = local_290[0];
      }
      if (uVar14 < (ulong)(local_2d8 + local_298)) {
        uVar14 = 0xf;
        if (local_2e0 != local_2d0) {
          uVar14 = local_2d0[0];
        }
        if (uVar14 < (ulong)(local_2d8 + local_298)) goto LAB_01f765bf;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2e0,0,(char *)0x0,(ulong)local_2a0);
      }
      else {
LAB_01f765bf:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_2e0);
      }
      puVar7 = puVar5 + 2;
      if ((ulong *)*puVar5 == puVar7) {
        local_2f8 = *puVar7;
        uStack_2f0 = *(undefined4 *)(puVar5 + 3);
        uStack_2ec = *(undefined4 *)((long)puVar5 + 0x1c);
        local_308 = &local_2f8;
      }
      else {
        local_2f8 = *puVar7;
        local_308 = (ulong *)*puVar5;
      }
      local_300 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)puVar7 = 0;
      local_280 = local_270;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_280,"/topology/thread_siblings_list","");
      uVar14 = 0xf;
      if (local_308 != &local_2f8) {
        uVar14 = local_2f8;
      }
      if (uVar14 < (ulong)(local_278 + local_300)) {
        uVar14 = 0xf;
        if (local_280 != local_270) {
          uVar14 = local_270[0];
        }
        if (uVar14 < (ulong)(local_278 + local_300)) goto LAB_01f76685;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_280,0,(char *)0x0,(ulong)local_308);
      }
      else {
LAB_01f76685:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_280);
      }
      puVar1 = puVar5 + 2;
      if ((undefined8 *)*puVar5 == puVar1) {
        local_2b0 = *puVar1;
        uStack_2a8 = puVar5[3];
        local_2c0 = &local_2b0;
      }
      else {
        local_2b0 = *puVar1;
        local_2c0 = (undefined8 *)*puVar5;
      }
      local_2b8 = puVar5[1];
      *puVar5 = puVar1;
      puVar5[1] = 0;
      *(undefined1 *)puVar1 = 0;
      if (local_280 != local_270) {
        operator_delete(local_280);
      }
      if (local_308 != &local_2f8) {
        operator_delete(local_308);
      }
      if (local_2e0 != local_2d0) {
        operator_delete(local_2e0);
      }
      if (local_2a0 != local_290) {
        operator_delete(local_2a0);
      }
      std::fstream::open((char *)local_248,(_Ios_Openmode)local_2c0);
      if ((*(byte *)((long)local_248[0].__bits + *(long *)(local_248[0].__bits[0] - 0x18) + 0x20) &
          5) != 0) goto LAB_01f7688d;
      while (plVar6 = (long *)std::istream::operator>>((istream *)local_248,(int *)&local_2a0),
            (*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
        puVar7 = (ulong *)(long)(int)local_2a0;
        uVar14 = (long)DAT_021d2eb8._M_current - (long)threadIDs;
        puVar8 = threadIDs;
        if (0 < (long)uVar14 >> 5) {
          puVar8 = (unsigned_long *)((uVar14 & 0xffffffffffffffe0) + (long)threadIDs);
          lVar12 = ((long)uVar14 >> 5) + 1;
          iVar9._M_current = threadIDs + 2;
          do {
            if ((int)local_2a0 == (int)iVar9._M_current[-2]) {
              iVar9._M_current = iVar9._M_current + -2;
              goto LAB_01f7681c;
            }
            if ((int)local_2a0 == (int)iVar9._M_current[-1]) {
              iVar9._M_current = iVar9._M_current + -1;
              goto LAB_01f7681c;
            }
            if ((int)local_2a0 == (int)*iVar9._M_current) goto LAB_01f7681c;
            if ((int)local_2a0 == (int)iVar9._M_current[1]) {
              iVar9._M_current = iVar9._M_current + 1;
              goto LAB_01f7681c;
            }
            lVar12 = lVar12 + -1;
            iVar9._M_current = iVar9._M_current + 4;
          } while (1 < lVar12);
          uVar14 = (long)DAT_021d2eb8._M_current - (long)puVar8;
        }
        lVar12 = (long)uVar14 >> 3;
        if (lVar12 == 1) {
LAB_01f76801:
          iVar9._M_current = puVar8;
          if ((int)local_2a0 != (int)*puVar8) {
            iVar9._M_current = DAT_021d2eb8._M_current;
          }
LAB_01f7681c:
          if (iVar9._M_current == DAT_021d2eb8._M_current) goto LAB_01f76821;
        }
        else {
          if (lVar12 == 2) {
LAB_01f767f9:
            iVar9._M_current = puVar8;
            if ((int)local_2a0 != (int)*puVar8) {
              puVar8 = puVar8 + 1;
              goto LAB_01f76801;
            }
            goto LAB_01f7681c;
          }
          if (lVar12 == 3) {
            iVar9._M_current = puVar8;
            if ((int)local_2a0 != (int)*puVar8) {
              puVar8 = puVar8 + 1;
              goto LAB_01f767f9;
            }
            goto LAB_01f7681c;
          }
LAB_01f76821:
          local_308 = puVar7;
          if (DAT_021d2eb8._M_current == DAT_021d2ec0) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&threadIDs,
                       DAT_021d2eb8,(unsigned_long *)&local_308);
          }
          else {
            *DAT_021d2eb8._M_current = (unsigned_long)puVar7;
            DAT_021d2eb8._M_current = DAT_021d2eb8._M_current + 1;
          }
        }
        iVar4 = std::istream::peek();
        if (iVar4 == 0x2c) {
          std::istream::ignore();
        }
      }
      std::fstream::close();
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0);
      }
      std::fstream::~fstream((istream *)local_248);
      local_2e8 = local_2e8 + 1;
    } while( true );
  }
LAB_01f76922:
  if (threadID < (ulong)((long)puVar8 - (long)threadIDs >> 3)) {
    threadID = threadIDs[threadID];
  }
  local_248[0].__bits[0xe] = 0;
  local_248[0].__bits[0xf] = 0;
  local_248[0].__bits[0xc] = 0;
  local_248[0].__bits[0xd] = 0;
  local_248[0].__bits[10] = 0;
  local_248[0].__bits[0xb] = 0;
  local_248[0].__bits[8] = 0;
  local_248[0].__bits[9] = 0;
  local_248[0].__bits[6] = 0;
  local_248[0].__bits[7] = 0;
  local_248[0].__bits[4] = 0;
  local_248[0].__bits[5] = 0;
  local_248[0].__bits[2] = 0;
  local_248[0].__bits[3] = 0;
  local_248[0].__bits[0] = 0;
  local_248[0].__bits[1] = 0;
  __th = pthread_self();
  iVar4 = pthread_getaffinity_np(__th,0x80,local_248);
  uVar15 = threadID;
  if (iVar4 == 0) {
    uVar14 = 0;
    iVar4 = 0;
    do {
      if ((local_248[0].__bits[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0) {
        uVar15 = uVar14;
        if (threadID == (long)iVar4) break;
        iVar4 = iVar4 + 1;
      }
      uVar14 = uVar14 + 1;
      uVar15 = threadID;
    } while (uVar14 != 0x400);
  }
  MutexSys::unlock((MutexSys *)&mutex);
  return uVar15;
LAB_01f7688d:
  if (local_2c0 != &local_2b0) {
    operator_delete(local_2c0);
  }
  std::fstream::~fstream(local_248);
  puVar8 = threadIDs;
  threadID = local_260;
  if (DAT_021d2eb8._M_current != threadIDs) {
    uVar14 = 0;
    puVar8 = DAT_021d2eb8._M_current;
    puVar10 = DAT_021d2eb8._M_current;
    do {
      puVar11 = threadIDs;
      if (puVar10 != threadIDs) {
        uVar13 = 0;
        do {
          if (((uVar14 != uVar13) && (puVar10 != threadIDs)) &&
             (threadIDs[uVar14] == threadIDs[uVar13])) {
            DAT_021d2eb8._M_current = threadIDs;
            puVar8 = threadIDs;
            puVar10 = threadIDs;
          }
          uVar13 = uVar13 + 1;
          puVar11 = puVar10;
        } while (uVar13 < (ulong)((long)puVar10 - (long)threadIDs >> 3));
      }
      uVar14 = uVar14 + 1;
      puVar10 = puVar11;
    } while (uVar14 < (ulong)((long)puVar11 - (long)threadIDs >> 3));
  }
  goto LAB_01f76922;
}

Assistant:

size_t mapThreadID(size_t threadID)
  {
    Lock<MutexSys> lock(mutex);
    
    if (threadIDs.size() == 0)
    {
      /* parse thread/CPU topology */
      for (size_t cpuID=0;;cpuID++)
      {
        std::fstream fs;
        std::string cpu = std::string("/sys/devices/system/cpu/cpu") + std::to_string((long long)cpuID) + std::string("/topology/thread_siblings_list");
        fs.open (cpu.c_str(), std::fstream::in);
        if (fs.fail()) break;

        int i;
        while (fs >> i) 
        {
          if (std::none_of(threadIDs.begin(),threadIDs.end(),[&] (int id) { return id == i; }))
            threadIDs.push_back(i);
          if (fs.peek() == ',') 
            fs.ignore();
        }
        fs.close();
      }

#if 0
      for (size_t i=0;i<threadIDs.size();i++)
        std::cout << i << " -> " << threadIDs[i] << std::endl;
#endif

      /* verify the mapping and do not use it if the mapping has errors */
      for (size_t i=0;i<threadIDs.size();i++) {
        for (size_t j=0;j<threadIDs.size();j++) {
          if (i != j && threadIDs[i] == threadIDs[j]) {
            threadIDs.clear();
          }
        }
      }
    }

    /* re-map threadIDs if mapping is available */
    size_t ID = threadID;
    if (threadID < threadIDs.size())
      ID = threadIDs[threadID];

    /* find correct thread to affinitize to */
    cpu_set_t set;
    CPU_ZERO(&set);
    
    if (pthread_getaffinity_np(pthread_self(), sizeof(set), &set) == 0)
    {
      for (int i=0, j=0; i<CPU_SETSIZE; i++)
      {
        if (!CPU_ISSET(i,&set)) continue;

        if (j == ID) {
          ID = i;
          break;
        }
        j++;
      }
    }

    return ID;
  }